

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

void djgc_start(djg_clock *clock)

{
  if (clock != (djg_clock *)0x0) {
    if (clock->is_cpu_ticking == 0) {
      clock->is_cpu_ticking = 1;
      (*glad_glGetInteger64v)(0x8e28,&clock->cpu_start_ticks);
    }
    if ((clock->is_gpu_ticking == 0) && (clock->is_gpu_ready != 0)) {
      (*glad_glQueryCounter)(clock->queries[0],0x8e28);
      clock->is_gpu_ticking = 1;
    }
    return;
  }
  __assert_fail("clock",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x117,"void djgc_start(djg_clock *)");
}

Assistant:

DJGDEF void djgc_start(djg_clock *clock)
{
    DJG_ASSERT(clock);
    if (!clock->is_cpu_ticking) {
        clock->is_cpu_ticking = GL_TRUE;
        glGetInteger64v(GL_TIMESTAMP, &clock->cpu_start_ticks);
    }
    if (!clock->is_gpu_ticking && clock->is_gpu_ready) {
        glQueryCounter(clock->queries[DJGC__QUERY_START], GL_TIMESTAMP);
        clock->is_gpu_ticking = GL_TRUE;
    }
}